

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O3

int sam_bam_cram_readrec(BGZF *bgzfp,void *fpv,void *bv,int *tid,int *beg,int *end)

{
  int iVar1;
  int iVar2;
  undefined4 *__ptr;
  undefined4 uVar3;
  int extraout_EDX;
  long lVar4;
  bam1_t *b;
  bam_seq_t *apbStack_58 [2];
  int iStack_44;
  int iStack_40;
  undefined4 uStack_3c;
  bam_seq_t *local_8;
  
  uVar3 = SUB84(tid,0);
  local_8 = (bam_seq_t *)bv;
  if (*(int *)((long)fpv + 0x44) == 6) {
    iVar1 = cram_get_bam_seq(*(cram_fd **)((long)fpv + 0x38),&local_8);
    return iVar1;
  }
  if (*(int *)((long)fpv + 0x44) == 4) {
    iVar1 = bam_read1(bgzfp,(bam1_t *)bv);
    return iVar1;
  }
  sam_bam_cram_readrec_cold_1();
  lVar4 = 0x50;
  apbStack_58[0] = (bam_seq_t *)0x13caaa;
  __ptr = (undefined4 *)calloc(1,0x50);
  if (__ptr != (undefined4 *)0x0) {
    *__ptr = 1;
    *(int **)(__ptr + 0xe) = beg;
    iVar1 = (int)fpv;
    if (iVar1 < 0) {
      if (iVar1 != -4) {
        if (iVar1 != -5) {
          apbStack_58[0] = (bam_seq_t *)cram_readrec;
          cram_itr_query_cold_1();
          iVar1 = cram_get_bam_seq(*(cram_fd **)(lVar4 + 0x38),apbStack_58);
          return iVar1;
        }
        *__ptr = 3;
      }
      goto LAB_0013caf1;
    }
    iStack_40 = extraout_EDX + 1;
    apbStack_58[0] = (bam_seq_t *)0x13cae3;
    iStack_44 = iVar1;
    uStack_3c = uVar3;
    iVar2 = cram_set_option(*(cram_fd **)&bgzfp->block_length,CRAM_OPT_RANGE);
    if (iVar2 == 0) {
      __ptr[1] = iVar1;
      __ptr[2] = extraout_EDX;
      __ptr[3] = uVar3;
      goto LAB_0013caf1;
    }
    apbStack_58[0] = (bam_seq_t *)0x13caef;
    free(__ptr);
  }
  __ptr = (undefined4 *)0x0;
LAB_0013caf1:
  return (int)__ptr;
}

Assistant:

static int sam_bam_cram_readrec(BGZF *bgzfp, void *fpv, void *bv, int *tid, int *beg, int *end)
{
    htsFile *fp = fpv;
    bam1_t *b = bv;
    switch (fp->format.format) {
    case bam:   return bam_read1(bgzfp, b);
    case cram:  return cram_get_bam_seq(fp->fp.cram, &b);
    default:
        // TODO Need headers available to implement this for SAM files
        fprintf(stderr, "[sam_bam_cram_readrec] Not implemented for SAM files -- Exiting\n");
        abort();
    }
}